

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg_ctr.c
# Opt level: O0

int ctr_BCC_blocks(PROV_DRBG_CTR *ctr,uchar *in)

{
  int iVar1;
  undefined8 *in_RSI;
  long in_RDI;
  uchar num_of_blk;
  uchar in_tmp [48];
  undefined3 in_stack_ffffffffffffffb4;
  
  iVar1 = CONCAT13(2,in_stack_ffffffffffffffb4);
  if (*(long *)(in_RDI + 0x28) != 0x10) {
    iVar1 = CONCAT13(3,in_stack_ffffffffffffffb4);
  }
  iVar1 = ctr_BCC_block((PROV_DRBG_CTR *)*in_RSI,(uchar *)in_RSI[1],(uchar *)*in_RSI,iVar1);
  return iVar1;
}

Assistant:

__owur static int ctr_BCC_blocks(PROV_DRBG_CTR *ctr, const unsigned char *in)
{
    unsigned char in_tmp[48];
    unsigned char num_of_blk = 2;

    memcpy(in_tmp, in, 16);
    memcpy(in_tmp + 16, in, 16);
    if (ctr->keylen != 16) {
        memcpy(in_tmp + 32, in, 16);
        num_of_blk = 3;
    }
    return ctr_BCC_block(ctr, ctr->KX, in_tmp, AES_BLOCK_SIZE * num_of_blk);
}